

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cws.c
# Opt level: O3

int nn_cws_create(nn_ep *ep)

{
  nn_queue_item *pnVar1;
  nn_fsm_event *self;
  nn_ep *self_00;
  int iVar2;
  nn_fsm *self_01;
  char *__s;
  size_t sVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  void *pvVar7;
  undefined1 *puVar8;
  char *pcVar9;
  undefined2 *puVar10;
  nn_ctx *ctx;
  size_t addrlen;
  char *pcVar11;
  int reconnect_ivl_max;
  int ipv4only;
  int msg_type;
  int reconnect_ivl;
  size_t sslen;
  size_t ipv4onlylen;
  sockaddr_storage ss;
  int local_f0;
  int local_ec;
  undefined1 local_e8 [4];
  int local_e4;
  void **local_e0;
  size_t local_d8;
  char *local_d0;
  nn_ep *local_c8;
  size_t local_c0;
  size_t local_b8;
  sockaddr_storage local_b0;
  
  self_01 = (nn_fsm *)nn_alloc_(0x1e88);
  if (self_01 == (nn_fsm *)0x0) {
    nn_cws_create_cold_5();
LAB_001a7b44:
    nn_cws_create_cold_1();
LAB_001a7b49:
    nn_cws_create_cold_2();
  }
  else {
    self_01[1].shutdown_fn = (nn_fsm_fn)ep;
    self_01[0x52].stopped.type = 0;
    nn_ep_tran_setup(ep,&nn_cws_ep_ops,self_01);
    local_b8 = 4;
    nn_ep_getopt(ep,0,0xe,&local_ec,&local_b8);
    if (local_b8 != 4) goto LAB_001a7b44;
    local_c8 = ep;
    __s = nn_ep_getaddr(ep);
    sVar3 = strlen(__s);
    pcVar4 = strchr(__s,0x3b);
    local_d0 = pcVar4 + 1;
    pcVar9 = local_d0;
    if (pcVar4 == (char *)0x0) {
      pcVar9 = __s;
    }
    pcVar5 = strrchr(__s,0x3a);
    pcVar11 = __s + sVar3;
    if (pcVar5 == (char *)0x0) {
      pcVar5 = strchr(__s,0x2f);
      if (pcVar5 != (char *)0x0) {
        pcVar11 = pcVar5;
      }
      pcVar6 = pcVar11 + -(long)pcVar9;
      self_01[0x52].stopped.srcptr = pcVar6;
      self_01[0x52].stopped.src = 0x50;
      pcVar5 = pcVar6;
    }
    else {
      pcVar6 = strchr(pcVar5,0x2f);
      if (pcVar6 != (char *)0x0) {
        pcVar11 = pcVar6;
      }
      self_01[0x52].stopped.srcptr = pcVar5 + -(long)pcVar9;
      iVar2 = nn_port_resolve(pcVar5 + 1,(size_t)(pcVar11 + ~(ulong)pcVar5));
      if (iVar2 < 0) goto LAB_001a793f;
      pcVar6 = pcVar11 + -(long)pcVar9;
      self_01[0x52].stopped.src = iVar2;
      pcVar5 = (char *)self_01[0x52].stopped.srcptr;
    }
    local_e0 = &self_01[0x52].stopped.srcptr;
    iVar2 = nn_dns_check_hostname(pcVar9,(size_t)pcVar5);
    if ((iVar2 < 0) &&
       (iVar2 = nn_literal_resolve(pcVar9,(size_t)*local_e0,local_ec,&local_b0,&local_c0), iVar2 < 0
       )) {
LAB_001a793f:
      nn_free(self_01);
      return -0x16;
    }
    if (pcVar4 == (char *)0x0) {
      pnVar1 = &self_01[0x51].stopped.item;
      nn_chunkref_init((nn_chunkref *)pnVar1,(size_t)(pcVar6 + 1));
      pvVar7 = nn_chunkref_data((nn_chunkref *)pnVar1);
      memcpy(pvVar7,__s,(size_t)pcVar6);
      pvVar7 = nn_chunkref_data((nn_chunkref *)pnVar1);
      *(char *)((long)pvVar7 + (long)pcVar6) = '\0';
      nn_chunkref_init((nn_chunkref *)&self_01[0x52].srcptr,1);
      puVar8 = (undefined1 *)nn_chunkref_data((nn_chunkref *)&self_01[0x52].srcptr);
      *puVar8 = 0x2a;
    }
    else {
      addrlen = (long)pcVar4 - (long)__s;
      iVar2 = nn_iface_resolve(__s,addrlen,local_ec,&local_b0,&local_c0);
      if (iVar2 < 0) {
        nn_free(self_01);
        return -0x13;
      }
      pnVar1 = &self_01[0x51].stopped.item;
      nn_chunkref_init((nn_chunkref *)pnVar1,(size_t)(pcVar6 + 1));
      pvVar7 = nn_chunkref_data((nn_chunkref *)pnVar1);
      memcpy(pvVar7,local_d0,(size_t)pcVar6);
      pvVar7 = nn_chunkref_data((nn_chunkref *)pnVar1);
      *(char *)((long)pvVar7 + (long)pcVar6) = '\0';
      nn_chunkref_init((nn_chunkref *)&self_01[0x52].srcptr,addrlen);
      pvVar7 = nn_chunkref_data((nn_chunkref *)&self_01[0x52].srcptr);
      memcpy(pvVar7,__s,addrlen);
    }
    sVar3 = strlen(pcVar11);
    self = &self_01[0x51].stopped;
    if (sVar3 == 0) {
      nn_chunkref_init((nn_chunkref *)self,2);
      puVar10 = (undefined2 *)nn_chunkref_data((nn_chunkref *)self);
      *puVar10 = 0x2f;
    }
    else {
      nn_chunkref_init((nn_chunkref *)self,sVar3 + 1);
      pcVar9 = (char *)nn_chunkref_data((nn_chunkref *)self);
      strncpy(pcVar9,pcVar11,sVar3 + 1);
    }
    self_00 = local_c8;
    ctx = nn_ep_getctx(local_c8);
    nn_fsm_init_root(self_01,nn_cws_handler,nn_cws_shutdown,ctx);
    *(undefined4 *)&self_01[1].fn = 1;
    nn_usock_init((nn_usock *)&self_01[1].state,1,self_01);
    local_d8 = 4;
    nn_ep_getopt(self_00,-4,1,local_e8,&local_d8);
    if (local_d8 != 4) goto LAB_001a7b49;
    *(undefined1 *)&self_01[10].stopped.item.next = local_e8[0];
    nn_ep_getopt(self_00,0,6,&local_e4,&local_d8);
    if (local_d8 == 4) {
      nn_ep_getopt(self_00,0,7,&local_f0,&local_d8);
      if (local_d8 == 4) {
        if (local_f0 == 0) {
          local_f0 = local_e4;
        }
        nn_backoff_init((nn_backoff *)&self_01[8].shutdown_fn,2,local_e4,local_f0,self_01);
        nn_sws_init((nn_sws *)(self_01 + 0xb),4,self_00,self_01);
        nn_dns_init((nn_dns *)&self_01[0x52].stopped.item,3,self_01);
        nn_fsm_start(self_01);
        return 0;
      }
      goto LAB_001a7b53;
    }
  }
  nn_cws_create_cold_3();
LAB_001a7b53:
  nn_cws_create_cold_4();
}

Assistant:

int nn_cws_create (struct nn_ep *ep)
{
    int rc;
    const char *addr;
    size_t addrlen;
    const char *semicolon;
    const char *hostname;
    size_t hostlen;
    const char *colon;
    const char *slash;
    const char *resource;
    size_t resourcelen;
    struct sockaddr_storage ss;
    size_t sslen;
    int ipv4only;
    size_t ipv4onlylen;
    struct nn_cws *self;
    int reconnect_ivl;
    int reconnect_ivl_max;
    int msg_type;
    size_t sz;

    /*  Allocate the new endpoint object. */
    self = nn_alloc (sizeof (struct nn_cws), "cws");
    alloc_assert (self);
    self->ep = ep;
    self->peer_gone = 0;

    /*  Initalise the endpoint. */
    nn_ep_tran_setup (ep, &nn_cws_ep_ops, self);

    /*  Check whether IPv6 is to be used. */
    ipv4onlylen = sizeof (ipv4only);
    nn_ep_getopt (ep, NN_SOL_SOCKET, NN_IPV4ONLY, &ipv4only, &ipv4onlylen);
    nn_assert (ipv4onlylen == sizeof (ipv4only));

    /*  Start parsing the address. */
    addr = nn_ep_getaddr (ep);
    addrlen = strlen (addr);
    semicolon = strchr (addr, ';');
    hostname = semicolon ? semicolon + 1 : addr;
    colon = strrchr (addr, ':');
    slash = colon ? strchr (colon, '/') : strchr (addr, '/');
    resource = slash ? slash : addr + addrlen;
    self->remote_hostname_len = colon ? colon - hostname : resource - hostname;

    /*  Host contains both hostname and port. */
    hostlen = resource - hostname;

    /*  Parse the port; assume port 80 if not explicitly declared. */
    if (colon != NULL) {
        rc = nn_port_resolve (colon + 1, resource - colon - 1);
        if (rc < 0) {
            nn_free(self);
            return -EINVAL;
        }
        self->remote_port = rc;
    }
    else {
        self->remote_port = 80;
    }

    /*  Check whether the host portion of the address is either a literal
        or a valid hostname. */
    if (nn_dns_check_hostname (hostname, self->remote_hostname_len) < 0 &&
          nn_literal_resolve (hostname, self->remote_hostname_len, ipv4only,
          &ss, &sslen) < 0) {
        nn_free(self);
        return -EINVAL;
    }

    /*  If local address is specified, check whether it is valid. */
    if (semicolon) {
        rc = nn_iface_resolve (addr, semicolon - addr, ipv4only, &ss, &sslen);
        if (rc < 0) {
            nn_free(self);
            return -ENODEV;
        }
    }

    /*  At this point, the address is valid, so begin allocating resources. */
    nn_chunkref_init (&self->remote_host, hostlen + 1);
    memcpy (nn_chunkref_data (&self->remote_host), hostname, hostlen);
    ((uint8_t *) nn_chunkref_data (&self->remote_host)) [hostlen] = '\0';

    if (semicolon) {
        nn_chunkref_init (&self->nic, semicolon - addr);
        memcpy (nn_chunkref_data (&self->nic),
            addr, semicolon - addr);
    }
    else {
        nn_chunkref_init (&self->nic, 1);
        memcpy (nn_chunkref_data (&self->nic), "*", 1);
    }

    /*  The requested resource is used in opening handshake. */
    resourcelen = strlen (resource);
    if (resourcelen) {
        nn_chunkref_init (&self->resource, resourcelen + 1);
        strncpy (nn_chunkref_data (&self->resource),
            resource, resourcelen + 1);
    }
    else {
        /*  No resource specified, so allocate base path. */
        nn_chunkref_init (&self->resource, 2);
        strncpy (nn_chunkref_data (&self->resource), "/", 2);
    }

    /*  Initialise the structure. */
    nn_fsm_init_root (&self->fsm, nn_cws_handler, nn_cws_shutdown,
        nn_ep_getctx (ep));
    self->state = NN_CWS_STATE_IDLE;
    nn_usock_init (&self->usock, NN_CWS_SRC_USOCK, &self->fsm);

    sz = sizeof (msg_type);
    nn_ep_getopt (ep, NN_WS, NN_WS_MSG_TYPE, &msg_type, &sz);
    nn_assert (sz == sizeof (msg_type));
    self->msg_type = (uint8_t) msg_type;

    sz = sizeof (reconnect_ivl);
    nn_ep_getopt (ep, NN_SOL_SOCKET, NN_RECONNECT_IVL, &reconnect_ivl, &sz);
    nn_assert (sz == sizeof (reconnect_ivl));
    sz = sizeof (reconnect_ivl_max);
    nn_ep_getopt (ep, NN_SOL_SOCKET, NN_RECONNECT_IVL_MAX,
        &reconnect_ivl_max, &sz);
    nn_assert (sz == sizeof (reconnect_ivl_max));
    if (reconnect_ivl_max == 0)
        reconnect_ivl_max = reconnect_ivl;
    nn_backoff_init (&self->retry, NN_CWS_SRC_RECONNECT_TIMER,
        reconnect_ivl, reconnect_ivl_max, &self->fsm);

    nn_sws_init (&self->sws, NN_CWS_SRC_SWS, ep, &self->fsm);
    nn_dns_init (&self->dns, NN_CWS_SRC_DNS, &self->fsm);

    /*  Start the state machine. */
    nn_fsm_start (&self->fsm);

    return 0;
}